

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

void __thiscall Parser::reportError(Parser *this,string *s)

{
  bool bVar1;
  ostream *poVar2;
  string sStack_48;
  
  getFilename_abi_cxx11_(&sStack_48,this);
  bVar1 = std::operator==(&sStack_48,"");
  std::__cxx11::string::~string((string *)&sStack_48);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Error: ");
    poVar2 = std::operator<<(poVar2,(string *)s);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,"Error in ");
    getFilename_abi_cxx11_(&sStack_48,this);
    poVar2 = std::operator<<(poVar2,(string *)&sStack_48);
    poVar2 = std::operator<<(poVar2,": ");
    poVar2 = std::operator<<(poVar2,(string *)s);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::~string((string *)&sStack_48);
  }
  return;
}

Assistant:

void Parser::reportError(const std::string& s)
{
	if ( getFilename()=="" )
		std::cout << "Error: " << s << std::endl;
	else
		std::cout << "Error in " << getFilename() << ": " << s << std::endl;
}